

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

CCPrepare * gen_prepare_cc(CCPrepare *__return_storage_ptr__,DisasContext *s,int b,TCGv_i64 reg)

{
  MemOp size;
  MemOp MVar1;
  TCGContext *tcg_ctx_00;
  uint uVar2;
  ulong uVar3;
  CCPrepare *extraout_RAX;
  CCPrepare *pCVar4;
  CCPrepare *extraout_RAX_00;
  TCGv_i64 pTVar5;
  target_ulong tVar6;
  TCGCond TVar7;
  _Bool _Var8;
  _Bool _Var9;
  uintptr_t o_4;
  TCGContext *tcg_ctx;
  undefined4 local_64;
  ushort local_60;
  undefined8 local_58;
  TCGv_i64 pTStack_50;
  TCGv_i64 local_48;
  TCGv_i32 local_40;
  TCGv_i64 local_38;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar2 = (uint)b >> 1 & 7;
  MVar1 = s->cc_op;
  size = MVar1 - MO_BESL;
  if (MO_64 < size) {
    switch(uVar2) {
    case 0:
      goto switchD_00535eac_caseD_0;
    case 1:
      goto code_r0x00536039;
    case 2:
      goto switchD_00535eac_caseD_2;
    case 3:
      gen_compute_eflags(s);
      pCVar4 = (CCPrepare *)tcg_ctx_00->cpu_cc_src;
      __return_storage_ptr__->cond = TCG_COND_NE;
      __return_storage_ptr__->reg = (TCGv_i64)pCVar4;
      __return_storage_ptr__->reg2 = (TCGv_i64)0x0;
      __return_storage_ptr__->imm = 0;
      __return_storage_ptr__->mask = 0x41;
      goto LAB_0053610a;
    case 4:
      goto switchD_00535eac_caseD_4;
    case 5:
      goto switchD_00535eac_caseD_5;
    case 6:
      gen_compute_eflags(s);
      if (tcg_ctx_00->cpu_cc_src == reg) {
        reg = s->tmp0;
      }
      tcg_gen_shri_i64_x86_64(tcg_ctx_00,reg,tcg_ctx_00->cpu_cc_src,4);
      tcg_gen_op3_x86_64(tcg_ctx_00,INDEX_op_xor_i64,(TCGArg)(reg + (long)&tcg_ctx_00->pool_cur),
                         (TCGArg)(reg + (long)&tcg_ctx_00->pool_cur),
                         (TCGArg)(tcg_ctx_00->cpu_cc_src + (long)tcg_ctx_00));
      __return_storage_ptr__->cond = TCG_COND_NE;
      __return_storage_ptr__->reg = reg;
      __return_storage_ptr__->reg2 = (TCGv_i64)0x0;
      __return_storage_ptr__->imm = 0;
      __return_storage_ptr__->mask = 0x80;
      pCVar4 = extraout_RAX_00;
      break;
    case 7:
      gen_compute_eflags(s);
      if (tcg_ctx_00->cpu_cc_src == reg) {
        reg = s->tmp0;
      }
      tcg_gen_shri_i64_x86_64(tcg_ctx_00,reg,tcg_ctx_00->cpu_cc_src,4);
      tcg_gen_op3_x86_64(tcg_ctx_00,INDEX_op_xor_i64,(TCGArg)(reg + (long)&tcg_ctx_00->pool_cur),
                         (TCGArg)(reg + (long)&tcg_ctx_00->pool_cur),
                         (TCGArg)(tcg_ctx_00->cpu_cc_src + (long)tcg_ctx_00));
      __return_storage_ptr__->cond = TCG_COND_NE;
      __return_storage_ptr__->reg = reg;
      __return_storage_ptr__->reg2 = (TCGv_i64)0x0;
      __return_storage_ptr__->imm = 0;
      __return_storage_ptr__->mask = 0xc0;
      pCVar4 = extraout_RAX;
    }
    __return_storage_ptr__->use_reg2 = false;
    __return_storage_ptr__->no_setcond = false;
    TVar7 = TCG_COND_NE;
    goto LAB_00536577;
  }
  switch(uVar2) {
  case 0:
switchD_00535eac_caseD_0:
    if (MVar1 + ~MO_ALIGN_8 < 2) {
      local_64 = 0;
      local_60 = 0;
      _Var8 = false;
      tVar6 = 0xffffffffffffffff;
      pTVar5 = (TCGv_i64)0x0;
      TVar7 = TCG_COND_NEVER;
    }
    else if (MVar1 - (MO_ALIGN_4|MO_BESL|MO_16) < 2) {
      pTVar5 = tcg_ctx_00->cpu_cc_src2;
      TVar7 = TCG_COND_NE;
      tVar6 = 0xffffffffffffffff;
      _Var8 = true;
    }
    else {
      gen_compute_eflags(s);
      pTVar5 = tcg_ctx_00->cpu_cc_src;
      TVar7 = TCG_COND_NE;
      tVar6 = 0x800;
      _Var8 = false;
    }
    __return_storage_ptr__->cond = TVar7;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
    __return_storage_ptr__->reg = pTVar5;
    __return_storage_ptr__->reg2 = (TCGv_i64)0x0;
    __return_storage_ptr__->imm = 0;
    __return_storage_ptr__->mask = tVar6;
    __return_storage_ptr__->use_reg2 = false;
    __return_storage_ptr__->no_setcond = _Var8;
    goto LAB_00536414;
  case 2:
switchD_00535eac_caseD_2:
    if ((int)MVar1 < 0x2e) {
      if (MVar1 == MO_8) {
        gen_compute_eflags(s);
      }
      else if (MVar1 != MO_16) {
LAB_0053629f:
        pTVar5 = gen_ext_tl(tcg_ctx_00,reg,tcg_ctx_00->cpu_cc_dst,MVar1 & MO_64 ^ MO_32,false);
        goto LAB_005362c2;
      }
    }
    else if (2 < MVar1 - (MO_ALIGN_4|MO_BESL)) {
      if (MVar1 == (MO_ALIGN_8|MO_16)) {
        TVar7 = TCG_COND_ALWAYS;
LAB_005363c9:
        local_60 = 0;
        local_64 = 0;
        tVar6 = 0xffffffffffffffff;
        pTVar5 = (TCGv_i64)0x0;
      }
      else {
        if (MVar1 != (MO_ALIGN_8|MO_32)) goto LAB_0053629f;
        pTVar5 = tcg_ctx_00->cpu_cc_src;
LAB_005362c2:
        tVar6 = 0xffffffffffffffff;
        TVar7 = TCG_COND_EQ;
      }
      goto LAB_005363f4;
    }
    pTVar5 = tcg_ctx_00->cpu_cc_src;
    tVar6 = 0x40;
LAB_005363ef:
    TVar7 = TCG_COND_NE;
    goto LAB_005363f4;
  case 3:
    pTVar5 = s->tmp4;
    if (pTVar5 != s->cc_srcT) {
      tcg_gen_op2_x86_64(tcg_ctx_00,INDEX_op_mov_i64,(TCGArg)(pTVar5 + (long)tcg_ctx_00),
                         (TCGArg)(s->cc_srcT + (long)tcg_ctx_00));
      pTVar5 = s->tmp4;
    }
    gen_ext_tl(tcg_ctx_00,pTVar5,pTVar5,size,false);
    pCVar4 = (CCPrepare *)gen_ext_tl(tcg_ctx_00,s->tmp0,tcg_ctx_00->cpu_cc_src,size,false);
    pTVar5 = s->tmp4;
    __return_storage_ptr__->cond = TCG_COND_LEU;
    __return_storage_ptr__->reg = pTVar5;
    __return_storage_ptr__->reg2 = (TCGv_i64)pCVar4;
    __return_storage_ptr__->imm = 0;
    __return_storage_ptr__->mask = 0xffffffffffffffff;
    __return_storage_ptr__->use_reg2 = true;
    __return_storage_ptr__->no_setcond = false;
    TVar7 = TCG_COND_LEU;
    goto LAB_00536577;
  case 4:
switchD_00535eac_caseD_4:
    if (MVar1 < (MO_ALIGN_8|MO_64)) {
      uVar3 = (ulong)MVar1;
      if ((0x1c00000000002U >> (uVar3 & 0x3f) & 1) == 0) {
        if ((0x6000000000000U >> (uVar3 & 0x3f) & 1) != 0) {
          TVar7 = TCG_COND_NEVER;
          goto LAB_005363c9;
        }
        if (uVar3 != 0) goto LAB_0053636a;
        gen_compute_eflags(s);
      }
      pTVar5 = tcg_ctx_00->cpu_cc_src;
      tVar6 = 0x80;
      goto LAB_005363ef;
    }
LAB_0053636a:
    pTVar5 = gen_ext_tl(tcg_ctx_00,reg,tcg_ctx_00->cpu_cc_dst,MVar1 & MO_64 ^ MO_32,true);
    tVar6 = 0xffffffffffffffff;
    TVar7 = TCG_COND_LT;
LAB_005363f4:
    __return_storage_ptr__->cond = TVar7;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
    __return_storage_ptr__->reg = pTVar5;
    __return_storage_ptr__->reg2 = (TCGv_i64)0x0;
    __return_storage_ptr__->imm = 0;
    __return_storage_ptr__->mask = tVar6;
    __return_storage_ptr__->use_reg2 = false;
    __return_storage_ptr__->no_setcond = false;
LAB_00536414:
    *(undefined4 *)&__return_storage_ptr__->field_0x2a = local_64;
    goto LAB_00536573;
  case 5:
switchD_00535eac_caseD_5:
    gen_compute_eflags(s);
    pCVar4 = (CCPrepare *)tcg_ctx_00->cpu_cc_src;
    __return_storage_ptr__->cond = TCG_COND_NE;
    __return_storage_ptr__->reg = (TCGv_i64)pCVar4;
    __return_storage_ptr__->reg2 = (TCGv_i64)0x0;
    __return_storage_ptr__->imm = 0;
    __return_storage_ptr__->mask = 4;
LAB_0053610a:
    __return_storage_ptr__->use_reg2 = false;
    __return_storage_ptr__->no_setcond = false;
    TVar7 = TCG_COND_NE;
    goto LAB_00536577;
  case 6:
    TVar7 = TCG_COND_LT;
    goto LAB_0053611f;
  case 7:
    TVar7 = TCG_COND_LE;
LAB_0053611f:
    pTVar5 = s->tmp4;
    if (pTVar5 != s->cc_srcT) {
      tcg_gen_op2_x86_64(tcg_ctx_00,INDEX_op_mov_i64,(TCGArg)(pTVar5 + (long)tcg_ctx_00),
                         (TCGArg)(s->cc_srcT + (long)tcg_ctx_00));
      pTVar5 = s->tmp4;
    }
    gen_ext_tl(tcg_ctx_00,pTVar5,pTVar5,size,true);
    pCVar4 = (CCPrepare *)gen_ext_tl(tcg_ctx_00,s->tmp0,tcg_ctx_00->cpu_cc_src,size,true);
    pTVar5 = s->tmp4;
    __return_storage_ptr__->cond = TVar7;
    __return_storage_ptr__->reg = pTVar5;
    __return_storage_ptr__->reg2 = (TCGv_i64)pCVar4;
    __return_storage_ptr__->imm = 0;
    __return_storage_ptr__->mask = 0xffffffffffffffff;
    __return_storage_ptr__->use_reg2 = true;
    __return_storage_ptr__->no_setcond = false;
    goto LAB_00536577;
  }
code_r0x00536039:
  switch(MVar1) {
  case MO_16:
  case MO_ALIGN_4|MO_LESL:
  case MO_ALIGN_4|MO_SSIZE:
  case MO_ALIGN_4|MO_BE:
  case MO_ALIGN_4|MO_BEUW:
    reg = tcg_ctx_00->cpu_cc_src;
    tVar6 = 1;
    goto LAB_0053653a;
  case MO_32:
  case MO_64:
  case MO_ASHIFT:
  case MO_LESW:
    reg = tcg_ctx_00->cpu_cc_src;
    tVar6 = 0xffffffffffffffff;
    goto LAB_0053653a;
  case MO_LESL:
  case MO_SSIZE:
  case MO_BE:
  case MO_BEUW:
    _Var8 = false;
    pTVar5 = gen_ext_tl(tcg_ctx_00,s->tmp0,tcg_ctx_00->cpu_cc_src,MVar1 - MO_LESL,false);
    reg = gen_ext_tl(tcg_ctx_00,reg,tcg_ctx_00->cpu_cc_dst,MVar1 - MO_LESL,false);
    TVar7 = TCG_COND_LTU;
    _Var9 = true;
    tVar6 = 0xffffffffffffffff;
    break;
  default:
    gen_update_cc_op(s);
    local_58 = (TCGTemp *)(tcg_ctx_00->cpu_cc_dst + (long)tcg_ctx_00);
    pTStack_50 = tcg_ctx_00->cpu_cc_src + (long)tcg_ctx_00;
    local_48 = tcg_ctx_00->cpu_cc_src2 + (long)tcg_ctx_00;
    local_40 = tcg_ctx_00->cpu_cc_op + (long)tcg_ctx_00;
    tcg_gen_callN_x86_64
              (tcg_ctx_00,helper_cc_compute_c_x86_64,(TCGTemp *)(reg + (long)&tcg_ctx_00->pool_cur),
               4,(TCGTemp **)&local_58);
    goto LAB_00536050;
  case MO_BESL:
  case MO_BESL|MO_16:
  case MO_ALIGN_2:
  case MO_ALIGN_2|MO_16:
    local_38 = gen_ext_tl(tcg_ctx_00,s->tmp0,tcg_ctx_00->cpu_cc_src,size,false);
    if (local_38 == tcg_ctx_00->cpu_cc_src) {
      reg = s->tmp0;
    }
    if (reg != s->cc_srcT) {
      tcg_gen_op2_x86_64(tcg_ctx_00,INDEX_op_mov_i64,(TCGArg)(reg + (long)&tcg_ctx_00->pool_cur),
                         (TCGArg)(s->cc_srcT + (long)tcg_ctx_00));
    }
    _Var8 = false;
    gen_ext_tl(tcg_ctx_00,reg,reg,size,false);
    TVar7 = TCG_COND_LTU;
    _Var9 = true;
    tVar6 = 0xffffffffffffffff;
    pTVar5 = local_38;
    break;
  case MO_ALIGN_2|MO_LESL:
  case MO_ALIGN_2|MO_SSIZE:
  case MO_ALIGN_2|MO_BE:
  case MO_ALIGN_2|MO_BEUW:
  case MO_ALIGN_8|MO_16:
  case MO_ALIGN_8|MO_32:
    local_58 = (TCGTemp *)0x0;
    _Var9 = false;
    tVar6 = 0xffffffffffffffff;
    _Var8 = false;
    reg = (TCGv_i64)0x0;
    TVar7 = TCG_COND_NEVER;
    pTVar5 = (TCGv_i64)0x0;
    break;
  case MO_ALIGN_2|MO_BEUL:
  case MO_ALIGN_2|MO_BEQ:
  case MO_ALIGN_2|MO_BE|MO_ASHIFT:
  case MO_ALIGN_2|MO_BESW:
  case MO_ALIGN_2|MO_BESL:
  case MO_ALIGN_2|MO_BESL|MO_16:
  case MO_ALIGN_4:
  case MO_ALIGN_4|MO_16:
    reg = tcg_ctx_00->cpu_cc_src;
    goto LAB_00536050;
  case MO_ALIGN_4|MO_32:
  case MO_ALIGN_4|MO_64:
  case MO_ALIGN_4|MO_ASHIFT:
  case MO_ALIGN_4|MO_LESW:
    reg = tcg_ctx_00->cpu_cc_src;
    tVar6 = 1L << ((char)(8 << ((char)MVar1 - 0x22U & 0x1f)) - 1U & 0x3f);
LAB_0053653a:
    TVar7 = TCG_COND_NE;
LAB_0053653d:
    _Var8 = false;
LAB_00536540:
    _Var9 = false;
    pTVar5 = (TCGv_i64)0x0;
    break;
  case MO_ALIGN_4|MO_BEUL:
  case MO_ALIGN_4|MO_BEQ:
  case MO_ALIGN_4|MO_BE|MO_ASHIFT:
  case MO_ALIGN_4|MO_BESW:
    reg = gen_ext_tl(tcg_ctx_00,reg,tcg_ctx_00->cpu_cc_src,MVar1 - (MO_ALIGN_4|MO_BEUL),false);
    TVar7 = TCG_COND_EQ;
    tVar6 = 0xffffffffffffffff;
    goto LAB_0053653d;
  case MO_ALIGN_4|MO_BESL:
  case MO_ALIGN_8:
    reg = tcg_ctx_00->cpu_cc_dst;
LAB_00536050:
    TVar7 = TCG_COND_NE;
    _Var8 = true;
    tVar6 = 0xffffffffffffffff;
    goto LAB_00536540;
  }
  __return_storage_ptr__->cond = TVar7;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
  __return_storage_ptr__->reg = reg;
  __return_storage_ptr__->reg2 = pTVar5;
  __return_storage_ptr__->imm = 0;
  __return_storage_ptr__->mask = tVar6;
  __return_storage_ptr__->use_reg2 = _Var9;
  __return_storage_ptr__->no_setcond = _Var8;
  *(undefined4 *)&__return_storage_ptr__->field_0x2a = (undefined4)local_58;
  local_60 = local_58._4_2_;
LAB_00536573:
  pCVar4 = (CCPrepare *)(ulong)local_60;
  *(ushort *)&__return_storage_ptr__->field_0x2e = local_60;
LAB_00536577:
  if ((b & 1U) != 0) {
    __return_storage_ptr__->cond = TVar7 ^ TCG_COND_ALWAYS;
  }
  return pCVar4;
}

Assistant:

static CCPrepare gen_prepare_cc(DisasContext *s, int b, TCGv reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int inv, jcc_op, cond;
    MemOp size;
    CCPrepare cc;
    TCGv t0;

    inv = b & 1;
    jcc_op = (b >> 1) & 7;

    switch (s->cc_op) {
    case CC_OP_SUBB:
    case CC_OP_SUBW:
    case CC_OP_SUBL:
    case CC_OP_SUBQ:
        /* We optimize relational operators for the cmp/jcc case.  */
        size = s->cc_op - CC_OP_SUBB;
        switch (jcc_op) {
        case JCC_BE:
            tcg_gen_mov_tl(tcg_ctx, s->tmp4, s->cc_srcT);
            gen_extu(tcg_ctx, size, s->tmp4);
            t0 = gen_ext_tl(tcg_ctx, s->tmp0, tcg_ctx->cpu_cc_src, size, false);
            cc = (CCPrepare) { .cond = TCG_COND_LEU, .reg = s->tmp4,
                               .reg2 = t0, .mask = -1, .use_reg2 = true };
            break;

        case JCC_L:
            cond = TCG_COND_LT;
            goto fast_jcc_l;
        case JCC_LE:
            cond = TCG_COND_LE;
        fast_jcc_l:
            tcg_gen_mov_tl(tcg_ctx, s->tmp4, s->cc_srcT);
            gen_exts(tcg_ctx, size, s->tmp4);
            t0 = gen_ext_tl(tcg_ctx, s->tmp0, tcg_ctx->cpu_cc_src, size, true);
            cc = (CCPrepare) { .cond = cond, .reg = s->tmp4,
                               .reg2 = t0, .mask = -1, .use_reg2 = true };
            break;

        default:
            goto slow_jcc;
        }
        break;

    default:
    slow_jcc:
        /* This actually generates good code for JC, JZ and JS.  */
        switch (jcc_op) {
        case JCC_O:
            cc = gen_prepare_eflags_o(s, reg);
            break;
        case JCC_B:
            cc = gen_prepare_eflags_c(s, reg);
            break;
        case JCC_Z:
            cc = gen_prepare_eflags_z(s, reg);
            break;
        case JCC_BE:
            gen_compute_eflags(s);
            cc = (CCPrepare) { .cond = TCG_COND_NE, .reg = tcg_ctx->cpu_cc_src,
                               .mask = CC_Z | CC_C };
            break;
        case JCC_S:
            cc = gen_prepare_eflags_s(s, reg);
            break;
        case JCC_P:
            cc = gen_prepare_eflags_p(s, reg);
            break;
        case JCC_L:
            gen_compute_eflags(s);
            if (reg == tcg_ctx->cpu_cc_src) {
                reg = s->tmp0;
            }
            tcg_gen_shri_tl(tcg_ctx, reg, tcg_ctx->cpu_cc_src, 4); /* CC_O -> CC_S */
            tcg_gen_xor_tl(tcg_ctx, reg, reg, tcg_ctx->cpu_cc_src);
            cc = (CCPrepare) { .cond = TCG_COND_NE, .reg = reg,
                               .mask = CC_S };
            break;
        default:
        case JCC_LE:
            gen_compute_eflags(s);
            if (reg == tcg_ctx->cpu_cc_src) {
                reg = s->tmp0;
            }
            tcg_gen_shri_tl(tcg_ctx, reg, tcg_ctx->cpu_cc_src, 4); /* CC_O -> CC_S */
            tcg_gen_xor_tl(tcg_ctx, reg, reg, tcg_ctx->cpu_cc_src);
            cc = (CCPrepare) { .cond = TCG_COND_NE, .reg = reg,
                               .mask = CC_S | CC_Z };
            break;
        }
        break;
    }

    if (inv) {
        cc.cond = tcg_invert_cond(cc.cond);
    }
    return cc;
}